

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O0

void __thiscall
soplex::SPxSimplifier<double>::SPxSimplifier(SPxSimplifier<double> *this,SPxSimplifier<double> *old)

{
  Timer *pTVar1;
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SPxSimplifier_004ec8a8;
  in_RDI[1] = *(undefined8 *)(in_RSI + 8);
  *(undefined4 *)(in_RDI + 3) = *(undefined4 *)(in_RSI + 0x18);
  *(undefined4 *)((long)in_RDI + 0x1c) = *(undefined4 *)(in_RSI + 0x1c);
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RSI + 0x20);
  *(undefined4 *)((long)in_RDI + 0x24) = *(undefined4 *)(in_RSI + 0x24);
  *(undefined4 *)(in_RDI + 5) = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)((long)in_RDI + 0x2c) = *(undefined4 *)(in_RSI + 0x2c);
  *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(in_RSI + 0x30);
  *(undefined4 *)((long)in_RDI + 0x34) = *(undefined4 *)(in_RSI + 0x34);
  in_RDI[7] = *(undefined8 *)(in_RSI + 0x38);
  in_RDI[8] = *(undefined8 *)(in_RSI + 0x40);
  in_RDI[9] = *(undefined8 *)(in_RSI + 0x48);
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x2a0923);
  pTVar1 = TimerFactory::createTimer((TYPE)((ulong)in_RSI >> 0x20));
  in_RDI[2] = pTVar1;
  return;
}

Assistant:

SPxSimplifier(const SPxSimplifier& old)
      : m_name(old.m_name)
      , m_timerType(old.m_timerType)
      , m_remRows(old.m_remRows)
      , m_remCols(old.m_remCols)
      , m_remNzos(old.m_remNzos)
      , m_chgBnds(old.m_chgBnds)
      , m_chgLRhs(old.m_chgLRhs)
      , m_keptBnds(old.m_keptBnds)
      , m_keptLRhs(old.m_keptLRhs)
      , m_objoffset(old.m_objoffset)
      , m_minReduction(old.m_minReduction)
      , spxout(old.spxout)
   {
      m_timeUsed = TimerFactory::createTimer(m_timerType);
      assert(isConsistent());
   }